

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::CloneVertexInterface
          (ProgramInterface *this,VaryingPassthrough *varying_passthrough)

{
  pointer ppVVar1;
  Variable *variable;
  GLchar *pGVar2;
  ProgramInterface *pPVar3;
  bool bVar4;
  ProgramInterface *pPVar5;
  size_t i;
  ulong uVar6;
  
  for (uVar6 = 0;
      ppVVar1 = (this->m_vertex).m_outputs.
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->m_vertex).m_outputs.
                            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3);
      uVar6 = uVar6 + 1) {
    variable = ppVVar1[uVar6];
    pGVar2 = GetStagePrefix::lut[1][variable->m_storage];
    cloneVariableForStage(this,variable,TESS_CTRL,pGVar2,varying_passthrough);
    cloneVariableForStage(this,variable,TESS_EVAL,pGVar2,varying_passthrough);
    cloneVariableForStage(this,variable,GEOMETRY,pGVar2,varying_passthrough);
    cloneVariableForStage(this,variable,FRAGMENT,pGVar2,varying_passthrough);
  }
  for (uVar6 = 0;
      ppVVar1 = (this->m_vertex).m_uniforms.
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->m_vertex).m_uniforms.
                            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3);
      uVar6 = uVar6 + 1) {
    pPVar3 = (ProgramInterface *)ppVVar1[uVar6];
    pGVar2 = GetStagePrefix::lut[1]
             [*(uint *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&pPVar3->m_compute + 5)];
    cloneVariableForStage(this,(Variable *)pPVar3,COMPUTE,pGVar2,varying_passthrough);
    cloneVariableForStage(this,(Variable *)pPVar3,TESS_CTRL,pGVar2,varying_passthrough);
    cloneVariableForStage(this,(Variable *)pPVar3,TESS_EVAL,pGVar2,varying_passthrough);
    cloneVariableForStage(this,(Variable *)pPVar3,GEOMETRY,pGVar2,varying_passthrough);
    cloneVariableForStage(this,(Variable *)pPVar3,FRAGMENT,pGVar2,varying_passthrough);
    pPVar5 = pPVar3;
    bVar4 = Utils::Variable::IsBlock((Variable *)pPVar3);
    if (bVar4) {
      replaceBinding(pPVar5,(Variable *)pPVar3,VERTEX);
    }
  }
  for (uVar6 = 0;
      ppVVar1 = (this->m_vertex).m_ssb_blocks.
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->m_vertex).m_ssb_blocks.
                            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3);
      uVar6 = uVar6 + 1) {
    pPVar3 = (ProgramInterface *)ppVVar1[uVar6];
    pGVar2 = GetStagePrefix::lut[1]
             [*(uint *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&pPVar3->m_compute + 5)];
    cloneVariableForStage(this,(Variable *)pPVar3,COMPUTE,pGVar2,varying_passthrough);
    cloneVariableForStage(this,(Variable *)pPVar3,TESS_CTRL,pGVar2,varying_passthrough);
    cloneVariableForStage(this,(Variable *)pPVar3,TESS_EVAL,pGVar2,varying_passthrough);
    cloneVariableForStage(this,(Variable *)pPVar3,GEOMETRY,pGVar2,varying_passthrough);
    cloneVariableForStage(this,(Variable *)pPVar3,FRAGMENT,pGVar2,varying_passthrough);
    pPVar5 = pPVar3;
    bVar4 = Utils::Variable::IsBlock((Variable *)pPVar3);
    if (bVar4) {
      replaceBinding(pPVar5,(Variable *)pPVar3,VERTEX);
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->m_compute);
  std::__cxx11::string::_M_assign((string *)&this->m_fragment);
  std::__cxx11::string::_M_assign((string *)&this->m_geometry);
  std::__cxx11::string::_M_assign((string *)&this->m_tess_ctrl);
  std::__cxx11::string::_M_assign((string *)&this->m_tess_eval);
  return;
}

Assistant:

void ProgramInterface::CloneVertexInterface(VaryingPassthrough& varying_passthrough)
{
	/* VS outputs >> TCS inputs >> TCS outputs >> ..  >> FS inputs */
	for (size_t i = 0; i < m_vertex.m_outputs.size(); ++i)
	{
		const Variable& vs_var = *m_vertex.m_outputs[i];
		const GLchar*   prefix = GetStagePrefix(Shader::VERTEX, vs_var.m_storage);

		cloneVariableForStage(vs_var, Shader::TESS_CTRL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_EVAL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::GEOMETRY, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::FRAGMENT, prefix, varying_passthrough);
	}

	/* Copy uniforms from VS to other stages */
	for (size_t i = 0; i < m_vertex.m_uniforms.size(); ++i)
	{
		Variable&	 vs_var = *m_vertex.m_uniforms[i];
		const GLchar* prefix = GetStagePrefix(Shader::VERTEX, vs_var.m_storage);

		cloneVariableForStage(vs_var, Shader::COMPUTE, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_CTRL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_EVAL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::GEOMETRY, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::FRAGMENT, prefix, varying_passthrough);

		/* Uniform blocks needs unique binding */
		if (true == vs_var.IsBlock())
		{
			replaceBinding(vs_var, Shader::VERTEX);
		}
	}

	/* Copy SSBs from VS to other stages */
	for (size_t i = 0; i < m_vertex.m_ssb_blocks.size(); ++i)
	{
		Variable&	 vs_var = *m_vertex.m_ssb_blocks[i];
		const GLchar* prefix = GetStagePrefix(Shader::VERTEX, vs_var.m_storage);

		cloneVariableForStage(vs_var, Shader::COMPUTE, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_CTRL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_EVAL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::GEOMETRY, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::FRAGMENT, prefix, varying_passthrough);

		/* SSBs blocks needs unique binding */
		if (true == vs_var.IsBlock())
		{
			replaceBinding(vs_var, Shader::VERTEX);
		}
	}

	m_compute.m_globals   = m_vertex.m_globals;
	m_fragment.m_globals  = m_vertex.m_globals;
	m_geometry.m_globals  = m_vertex.m_globals;
	m_tess_ctrl.m_globals = m_vertex.m_globals;
	m_tess_eval.m_globals = m_vertex.m_globals;
}